

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

bool cmCMakePresetsGraphInternal::PresetStringHelper(string *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_61;
  string local_60;
  ErrorGenerator local_40;
  cmJSONState *local_20;
  cmJSONState *state_local;
  Value *value_local;
  string *out_local;
  
  local_20 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::helper_abi_cxx11_
      == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)
                                 ::helper_abi_cxx11_);
    if (iVar2 != 0) {
      std::function<void(Json::Value_const*,cmJSONState*)>::
      function<void(&)(Json::Value_const*,cmJSONState*),void>
                ((function<void(Json::Value_const*,cmJSONState*)> *)&local_40,
                 JsonErrors::INVALID_STRING);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
      cmJSONHelperBuilder::String
                (&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
                  helper_abi_cxx11_,&local_40,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
      std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_40);
      __cxa_atexit(std::
                   function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                   ::~function,
                   &PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
                    helper_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)
                           ::helper_abi_cxx11_);
    }
  }
  bVar1 = std::
          function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
                        helper_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       value_local,(Value *)state_local,local_20);
  return bVar1;
}

Assistant:

bool PresetStringHelper(std::string& out, const Json::Value* value,
                        cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::String();
  return helper(out, value, state);
}